

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::AdamOptimizer::SerializeWithCachedSizes
          (AdamOptimizer *this,CodedOutputStream *output)

{
  bool bVar1;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  AdamOptimizer *this_local;
  
  bVar1 = has_learningrate(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&this->learningrate_->super_MessageLite,output);
  }
  bVar1 = has_minibatchsize(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&this->minibatchsize_->super_MessageLite,output);
  }
  bVar1 = has_beta1(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (3,&this->beta1_->super_MessageLite,output);
  }
  bVar1 = has_beta2(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (4,&this->beta2_->super_MessageLite,output);
  }
  bVar1 = has_eps(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (5,&this->eps_->super_MessageLite,output);
  }
  return;
}

Assistant:

void AdamOptimizer::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.AdamOptimizer)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.DoubleParameter learningRate = 1;
  if (this->has_learningrate()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *this->learningrate_, output);
  }

  // .CoreML.Specification.Int64Parameter miniBatchSize = 2;
  if (this->has_minibatchsize()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *this->minibatchsize_, output);
  }

  // .CoreML.Specification.DoubleParameter beta1 = 3;
  if (this->has_beta1()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      3, *this->beta1_, output);
  }

  // .CoreML.Specification.DoubleParameter beta2 = 4;
  if (this->has_beta2()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      4, *this->beta2_, output);
  }

  // .CoreML.Specification.DoubleParameter eps = 5;
  if (this->has_eps()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      5, *this->eps_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.AdamOptimizer)
}